

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [16];
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar8 = _DAT_00477260;
  do {
    uVar1 = *(undefined4 *)mask;
    auVar13[0] = (char)uVar1;
    cVar9 = (char)((uint)uVar1 >> 8);
    cVar10 = (char)((uint)uVar1 >> 0x10);
    cVar11 = (char)((uint)uVar1 >> 0x18);
    uVar2 = *(undefined4 *)src0;
    uVar3 = *(undefined4 *)src1;
    auVar12._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar3 >> 0x18),(char)((uint)uVar2 >> 0x18)),
                                 (char)((uint)uVar3 >> 0x10)),
                        CONCAT14((char)((uint)uVar2 >> 0x10),uVar2)) >> 0x20);
    auVar12[3] = (char)((uint)uVar3 >> 8);
    auVar12[2] = (char)((uint)uVar2 >> 8);
    auVar12[0] = (undefined1)uVar2;
    auVar12[1] = (char)uVar3;
    auVar12._8_8_ = 0;
    auVar13._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11('@' - cVar11,cVar11),'@' - cVar10),CONCAT14(cVar10,uVar1))
              >> 0x20);
    auVar13[3] = '@' - cVar9;
    auVar13[2] = cVar9;
    auVar13[1] = '@' - auVar13[0];
    auVar13._8_8_ = 0;
    auVar13 = pmaddubsw(auVar12,auVar13);
    auVar13 = pmulhrsw(auVar13,auVar8);
    sVar4 = auVar13._0_2_;
    sVar5 = auVar13._2_2_;
    sVar6 = auVar13._4_2_;
    sVar7 = auVar13._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar13[6] - (0xff < sVar7),
                            CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar13[4] - (0xff < sVar6),
                                     CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar13[2] -
                                              (0xff < sVar5),
                                              (0 < sVar4) * (sVar4 < 0x100) * auVar13[0] -
                                              (0xff < sVar4))));
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + mask_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_w4_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                     const uint8_t *src0, uint32_t src0_stride,
                                     const uint8_t *src1, uint32_t src1_stride,
                                     const uint8_t *mask, uint32_t mask_stride,
                                     int w, int h) {
  (void)w;
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    const __m128i v_m0_b = xx_loadl_32(mask);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);
    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}